

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O2

int __thiscall cmCPackGenerator::CleanTemporaryDirectory(cmCPackGenerator *this)

{
  cmCPackLog *pcVar1;
  bool bVar2;
  char *__s;
  ostream *poVar3;
  int iVar4;
  allocator<char> local_1d1;
  char *local_1d0 [4];
  string tempInstallDirectory;
  ostringstream cmCPackLog_msg;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCPackLog_msg,"CPACK_TEMPORARY_INSTALL_DIRECTORY",
             (allocator<char> *)local_1d0);
  __s = GetOption(this,(string *)&cmCPackLog_msg);
  std::__cxx11::string::string<std::allocator<char>>((string *)&tempInstallDirectory,__s,&local_1d1)
  ;
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  bVar2 = cmsys::SystemTools::FileExists(&tempInstallDirectory);
  if (bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
    poVar3 = std::operator<<((ostream *)&cmCPackLog_msg,"- Clean temporary : ");
    poVar3 = std::operator<<(poVar3,(string *)&tempInstallDirectory);
    std::endl<char,std::char_traits<char>>(poVar3);
    pcVar1 = this->Logger;
    std::__cxx11::stringbuf::str();
    iVar4 = 1;
    cmCPackLog::Log(pcVar1,1,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x4ef,local_1d0[0]);
    std::__cxx11::string::~string((string *)local_1d0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
    bVar2 = cmSystemTools::RepeatedRemoveDirectory(&tempInstallDirectory);
    if (!bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
      poVar3 = std::operator<<((ostream *)&cmCPackLog_msg,"Problem removing temporary directory: ");
      poVar3 = std::operator<<(poVar3,(string *)&tempInstallDirectory);
      std::endl<char,std::char_traits<char>>(poVar3);
      pcVar1 = this->Logger;
      std::__cxx11::stringbuf::str();
      cmCPackLog::Log(pcVar1,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x4f3,local_1d0[0]);
      std::__cxx11::string::~string((string *)local_1d0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
      iVar4 = 0;
    }
  }
  else {
    iVar4 = 1;
  }
  std::__cxx11::string::~string((string *)&tempInstallDirectory);
  return iVar4;
}

Assistant:

int cmCPackGenerator::CleanTemporaryDirectory()
{
  std::string tempInstallDirectory =
    this->GetOption("CPACK_TEMPORARY_INSTALL_DIRECTORY");
  if (cmsys::SystemTools::FileExists(tempInstallDirectory)) {
    cmCPackLogger(cmCPackLog::LOG_OUTPUT,
                  "- Clean temporary : " << tempInstallDirectory << std::endl);
    if (!cmSystemTools::RepeatedRemoveDirectory(tempInstallDirectory)) {
      cmCPackLogger(cmCPackLog::LOG_ERROR,
                    "Problem removing temporary directory: "
                      << tempInstallDirectory << std::endl);
      return 0;
    }
  }
  return 1;
}